

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_unpolar<ExchCXX::BuiltinPC07OPT_K>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  ulong uVar1;
  ulong uVar2;
  double sigma_00;
  double tau_00;
  double e;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  ulong local_58;
  double local_50;
  const_host_buffer_type local_48;
  const_host_buffer_type local_40;
  const_host_buffer_type local_38;
  
  if (0 < N) {
    uVar1 = (ulong)(uint)N;
    uVar2 = 0;
    local_58 = uVar1;
    local_50 = scal_fact;
    local_48 = sigma;
    local_40 = lapl;
    local_38 = tau;
    do {
      if (rho[uVar2] <= 1e-15) {
        local_60 = 0.0;
        local_68 = 0.0;
        local_70 = 0.0;
        local_78 = 0.0;
        local_80 = 0.0;
      }
      else {
        sigma_00 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= local_48[uVar2]) {
          sigma_00 = local_48[uVar2];
        }
        tau_00 = 0.0;
        if (0.0 <= local_38[uVar2]) {
          tau_00 = local_38[uVar2];
        }
        kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_vxc_unpolar_impl
                  (rho[uVar2],sigma_00,local_40[uVar2],tau_00,&local_60,&local_68,&local_70,
                   &local_78,&local_80);
        uVar1 = local_58;
        scal_fact = local_50;
      }
      eps[uVar2] = local_60 * scal_fact + eps[uVar2];
      vrho[uVar2] = local_68 * scal_fact + vrho[uVar2];
      vsigma[uVar2] = local_70 * scal_fact + vsigma[uVar2];
      vtau[uVar2] = local_80 * scal_fact + vtau[uVar2];
      vlapl[uVar2] = local_78 * scal_fact + vlapl[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const auto lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    double e, vr, vs, vl, vt;
    
    traits::eval_exc_vxc_unpolar( rho[i], sigma[i], lapl_i, tau[i], 
      e, vr, vs, vl, vt );
    eps[i]    += scal_fact * e;
    vrho[i]   += scal_fact * vr;
    vsigma[i] += scal_fact * vs;
    vtau[i]   += scal_fact * vt;
    if(traits::needs_laplacian) vlapl[i] += scal_fact * vl;

  }


}